

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

int NULLCTypeInfo::IsSimple(int id)

{
  ExternTypeInfo *pEVar1;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),id);
    return (int)(pEVar1->subCat == CAT_NONE);
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x8b,"int NULLCTypeInfo::IsSimple(int)");
}

Assistant:

int IsSimple(int id)
	{
		assert(linker);
		return linker->exTypes[id].subCat == ExternTypeInfo::CAT_NONE;
	}